

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

void Imf_2_5::precalculateTileInfo
               (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int **numXTiles,
               int **numYTiles,int *numXLevels,int *numYLevels)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int *piVar6;
  LevelRoundingMode in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined8 *in_R9;
  TileDescription *unaff_retaddr;
  
  iVar3 = anon_unknown_12::calculateNumXLevels
                    (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX);
  *(int *)CONCAT44(minY,maxY) = iVar3;
  iVar3 = anon_unknown_12::calculateNumYLevels
                    (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX);
  *(int *)CONCAT44(minX,maxX) = iVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)CONCAT44(minY,maxY);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *in_R9 = pvVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)CONCAT44(minX,maxX);
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  *numXTiles = piVar6;
  anon_unknown_12::calculateNumTiles
            ((int *)unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX,in_ECX);
  anon_unknown_12::calculateNumTiles
            ((int *)unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX,in_ECX);
  return;
}

Assistant:

void
precalculateTileInfo (const TileDescription& tileDesc,
		      int minX, int maxX,
		      int minY, int maxY,
		      int *&numXTiles, int *&numYTiles,
		      int &numXLevels, int &numYLevels)
{
    numXLevels = calculateNumXLevels(tileDesc, minX, maxX, minY, maxY);
    numYLevels = calculateNumYLevels(tileDesc, minX, maxX, minY, maxY);
    
    numXTiles = new int[numXLevels];
    numYTiles = new int[numYLevels];

    calculateNumTiles (numXTiles,
		       numXLevels,
		       minX, maxX,
		       tileDesc.xSize,
		       tileDesc.roundingMode);

    calculateNumTiles (numYTiles,
		       numYLevels,
		       minY, maxY,
		       tileDesc.ySize,
		       tileDesc.roundingMode);
}